

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::Lock(CWallet *this)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pAVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CWallet *in_stack_ffffffffffffff88;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = IsCrypted(in_stack_ffffffffffffff88);
  if (bVar2) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff88);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
    pAVar3 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                       ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff88);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char *)in_RDI,
               (int)((ulong)pAVar3 >> 0x20),SUB81((ulong)pAVar3 >> 0x18,0));
    bVar2 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::empty
                      (in_stack_ffffffffffffff98);
    if (!bVar2) {
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffff88);
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffff88);
      memory_cleanse(in_stack_ffffffffffffff88,0x16fa50e);
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffff88);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()((signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
                  *)in_stack_ffffffffffffff88,(CWallet *)0x16fa57a);
    local_29 = true;
  }
  else {
    local_29 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::Lock()
{
    if (!IsCrypted())
        return false;

    {
        LOCK2(m_relock_mutex, cs_wallet);
        if (!vMasterKey.empty()) {
            memory_cleanse(vMasterKey.data(), vMasterKey.size() * sizeof(decltype(vMasterKey)::value_type));
            vMasterKey.clear();
        }
    }

    NotifyStatusChanged(this);
    return true;
}